

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzrot::NodeIntLoadResidual_F
          (ChNodeFEAxyzrot *this,uint off,ChVectorDynamic<> *R,double c)

{
  undefined1 *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChVectorDynamic<> *vector;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double c_local;
  double local_e8;
  ChVectorDynamic<> *local_e0;
  undefined1 local_d8 [16];
  ChVector<double> v;
  undefined1 local_a8 [16];
  scalar_constant_op<double> sStack_98;
  StorageBaseType *local_78 [2];
  ChVector<double> local_68 [2];
  
  v.m_data[1] = v.m_data[0];
  this_00 = &(this->super_ChNodeFEAbase).field_0x18;
  c_local = c;
  local_e0 = R;
  ChFrameMoving<double>::GetWvel_loc(local_68,(ChFrameMoving<double> *)this_00);
  ChFrameMoving<double>::GetWvel_loc(&v,(ChFrameMoving<double> *)this_00);
  ChMatrix33<double>::operator*(&(this->variables).inertia,&v);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_68[0].m_data[0];
  auVar6._8_8_ = local_68[0].m_data[2];
  auVar6._0_8_ = local_68[0].m_data[2];
  auVar2._8_8_ = local_68[0].m_data[2];
  auVar2._0_8_ = local_68[0].m_data[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_a8._0_8_;
  auVar8._8_8_ = sStack_98.m_other;
  auVar8._0_8_ = sStack_98.m_other;
  auVar1._8_8_ = sStack_98.m_other;
  auVar1._0_8_ = local_a8._8_8_;
  v.m_data[0] = (double)&this->Force;
  auVar4 = vunpcklpd_avx(auVar6,auVar5);
  auVar3 = vunpcklpd_avx(auVar8,auVar3);
  auVar7._0_8_ = (double)local_a8._8_8_ * auVar4._0_8_;
  auVar7._8_8_ = sStack_98.m_other * auVar4._8_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (double)local_a8._0_8_ * local_68[0].m_data[1];
  auVar4 = vfmsub231sd_fma(auVar4,auVar5,auVar1);
  local_d8 = vfmsub213pd_fma(auVar3,auVar2,auVar7);
  local_e8 = auVar4._0_8_;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)local_a8,&c_local,(StorageBaseType *)&v);
  vector = local_e0;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,local_e0,(ulong)off
             ,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)local_68,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)local_a8);
  v.m_data._0_16_ = vsubpd_avx(*(undefined1 (*) [16])(this->Torque).m_data,local_d8);
  v.m_data[2] = (this->Torque).m_data[2] - local_e8;
  local_78[0] = (StorageBaseType *)&v;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)local_a8,&c_local,(StorageBaseType *)local_78);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,vector,
             (ulong)(off + 3),3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)local_68,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)local_a8);
  return;
}

Assistant:

void ChNodeFEAxyzrot::NodeIntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    ChVector<> gyro = Vcross(this->GetWvel_loc(), (variables.GetBodyInertia() * this->GetWvel_loc()));

    R.segment(off + 0, 3) += c * Force.eigen();
    R.segment(off + 3, 3) += c * (Torque - gyro).eigen();
}